

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O1

void __thiscall VW::SpanningTree::SpanningTree(SpanningTree *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  vw_exception *pvVar5;
  char *pcVar6;
  int on;
  sockaddr_in address;
  stringstream __msg;
  char __errmsg [256];
  undefined4 local_314;
  string local_310;
  string local_2f0;
  string local_2d0;
  sockaddr local_2b0;
  stringstream local_2a0 [16];
  ostream local_290 [376];
  char local_118 [256];
  
  this->m_stop = false;
  this->port = 0x67af;
  this->m_future = (future<void> *)0x0;
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_290,"socket: ",8);
    piVar2 = __errno_location();
    pcVar6 = local_118;
    pcVar3 = strerror_r(*piVar2,pcVar6,0x100);
    if (pcVar3 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_290,"errno = ",8);
      sVar4 = strlen(pcVar6);
    }
    else {
      sVar4 = 0xf;
      pcVar6 = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_290,pcVar6,sVar4);
    pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (pvVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
               ,0x5f,&local_2d0);
    __cxa_throw(pvVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  local_314 = 1;
  iVar1 = setsockopt(iVar1,1,2,&local_314,4);
  if (-1 < iVar1) {
    local_2b0.sa_family = 2;
    local_2b0.sa_data[2] = '\0';
    local_2b0.sa_data[3] = '\0';
    local_2b0.sa_data[4] = '\0';
    local_2b0.sa_data[5] = '\0';
    local_2b0.sa_data._0_2_ = this->port << 8 | this->port >> 8;
    iVar1 = bind(this->sock,&local_2b0,0x10);
    if (-1 < iVar1) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_290,"bind: ",6);
    piVar2 = __errno_location();
    pcVar6 = local_118;
    pcVar3 = strerror_r(*piVar2,pcVar6,0x100);
    if (pcVar3 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_290,"errno = ",8);
      sVar4 = strlen(pcVar6);
    }
    else {
      sVar4 = 0xf;
      pcVar6 = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_290,pcVar6,sVar4);
    pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (pvVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
               ,0x6b,&local_310);
    __cxa_throw(pvVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  std::__cxx11::stringstream::stringstream(local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_290,"setsockopt SO_REUSEADDR: ",0x19);
  piVar2 = __errno_location();
  pcVar6 = local_118;
  pcVar3 = strerror_r(*piVar2,pcVar6,0x100);
  if (pcVar3 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_290,"errno = ",8);
    sVar4 = strlen(pcVar6);
  }
  else {
    sVar4 = 0xf;
    pcVar6 = "errno = unknown";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_290,pcVar6,sVar4);
  pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (pvVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
             ,99,&local_2f0);
  __cxa_throw(pvVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

SpanningTree::SpanningTree() : m_stop(false), port(26543), m_future(nullptr)
{
#ifdef _WIN32
  WSAData wsaData;
  int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
  if (lastError != 0)
    THROWERRNO("WSAStartup() returned error:" << lastError);
#endif

  sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock < 0)
    THROWERRNO("socket: ");

  int on = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
    THROWERRNO("setsockopt SO_REUSEADDR: ");

  sockaddr_in address;
  address.sin_family = AF_INET;
  address.sin_addr.s_addr = htonl(INADDR_ANY);

  address.sin_port = htons(port);
  if (::bind(sock, (sockaddr*)&address, sizeof(address)) < 0)
    THROWERRNO("bind: ");
}